

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O3

Hop_Obj_t * Hop_Multi_rec(Hop_Man_t *p,Hop_Obj_t **ppObjs,int nObjs,Hop_Type_t Type)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *p1;
  int nObjs_00;
  
  if (nObjs == 1) {
    return *ppObjs;
  }
  nObjs_00 = nObjs / 2;
  pHVar1 = Hop_Multi_rec(p,ppObjs,nObjs_00,Type);
  p1 = Hop_Multi_rec(p,ppObjs + nObjs_00,nObjs - nObjs_00,Type);
  pHVar1 = Hop_Oper(p,pHVar1,p1,Type);
  return pHVar1;
}

Assistant:

Hop_Obj_t * Hop_Multi_rec( Hop_Man_t * p, Hop_Obj_t ** ppObjs, int nObjs, Hop_Type_t Type )
{
    Hop_Obj_t * pObj1, * pObj2;
    if ( nObjs == 1 )
        return ppObjs[0];
    pObj1 = Hop_Multi_rec( p, ppObjs,           nObjs/2,         Type );
    pObj2 = Hop_Multi_rec( p, ppObjs + nObjs/2, nObjs - nObjs/2, Type );
    return Hop_Oper( p, pObj1, pObj2, Type );
}